

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_idate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  tm *ptVar3;
  uint local_b0;
  uint local_ac;
  int local_9c;
  int nDays;
  tm *pTm_1;
  time_t t_1;
  time_t t;
  tm *pTm;
  Sytm sTm;
  long lStack_38;
  int nLen;
  jx9_int64 iVal;
  char *zFormat;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  lStack_38 = 0;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_int(pCtx,-1);
  }
  else {
    pcVar2 = jx9_value_to_string(*apArg,(int *)((long)&sTm.tm_gmtoff + 4));
    if (sTm.tm_gmtoff._4_4_ < 1) {
      jx9_result_int(pCtx,-1);
    }
    if (nArg < 2) {
      time(&t_1);
      t = (time_t)localtime(&t_1);
      sTm.tm_sec = ((tm *)t)->tm_hour;
      pTm._4_4_ = ((tm *)t)->tm_min;
      pTm._0_4_ = ((tm *)t)->tm_sec;
      sTm.tm_hour = ((tm *)t)->tm_mon;
      sTm.tm_min = ((tm *)t)->tm_mday;
      iVar1 = ((tm *)t)->tm_year;
      sTm.tm_year = ((tm *)t)->tm_yday;
      sTm.tm_mon = ((tm *)t)->tm_wday;
      sTm.tm_wday = ((tm *)t)->tm_isdst;
    }
    else {
      iVar1 = jx9_value_is_int(apArg[1]);
      if (iVar1 == 0) {
        time((time_t *)&pTm_1);
      }
      else {
        pTm_1 = (tm *)jx9_value_to_int64(apArg[1]);
        ptVar3 = localtime((time_t *)&pTm_1);
        if (ptVar3 == (tm *)0x0) {
          time((time_t *)&pTm_1);
        }
      }
      ptVar3 = localtime((time_t *)&pTm_1);
      sTm.tm_sec = ptVar3->tm_hour;
      pTm._4_4_ = ptVar3->tm_min;
      pTm._0_4_ = ptVar3->tm_sec;
      sTm.tm_hour = ptVar3->tm_mon;
      sTm.tm_min = ptVar3->tm_mday;
      iVar1 = ptVar3->tm_year;
      sTm.tm_year = ptVar3->tm_yday;
      sTm.tm_mon = ptVar3->tm_wday;
      sTm.tm_wday = ptVar3->tm_isdst;
    }
    sTm.tm_mday = iVar1 + 0x76c;
    sTm.tm_zone = (char *)0x0;
    sTm.tm_isdst = 0;
    sTm._36_4_ = 0;
    switch(*pcVar2) {
    case 'H':
      lStack_38 = (long)sTm.tm_sec;
      break;
    case 'I':
      lStack_38 = (long)sTm.tm_wday;
      break;
    default:
      jx9_context_throw_error(pCtx,2,"Unknown date format token");
      break;
    case 'L':
      if (sTm.tm_mday % 400 == 0) {
        local_b0 = 1;
      }
      else {
        if (sTm.tm_mday % 100 == 0) {
          local_ac = 0;
        }
        else {
          local_ac = (uint)(sTm.tm_mday % 4 == 0);
        }
        local_b0 = local_ac;
      }
      lStack_38 = (long)(int)local_b0;
      break;
    case 'U':
      lStack_38 = time((time_t *)0x0);
      break;
    case 'W':
      lStack_38 = (long)jx9Builtin_idate::aISO8601[sTm.tm_mon % 7];
      break;
    case 'Y':
      lStack_38 = (long)sTm.tm_mday;
      break;
    case 'Z':
      lStack_38 = 0;
      break;
    case 'd':
      lStack_38 = (long)sTm.tm_min;
      break;
    case 'h':
      lStack_38 = (long)(sTm.tm_sec % 0xc + 1);
      break;
    case 'i':
      lStack_38 = (long)pTm._4_4_;
      break;
    case 'm':
      lStack_38 = (long)sTm.tm_hour;
      break;
    case 's':
      lStack_38 = (long)(int)pTm;
      break;
    case 't':
      local_9c = jx9Builtin_idate::aMonDays[sTm.tm_hour % 0xc];
      if (((sTm.tm_hour == 1) && (sTm.tm_mday % 400 != 0)) &&
         ((sTm.tm_mday % 100 == 0 || (sTm.tm_mday % 4 != 0)))) {
        local_9c = 0x1c;
      }
      lStack_38 = (long)local_9c;
      break;
    case 'w':
      lStack_38 = (long)sTm.tm_mon;
      break;
    case 'y':
      lStack_38 = (long)(sTm.tm_mday % 100);
      break;
    case 'z':
      lStack_38 = (long)sTm.tm_year;
    }
    jx9_result_int64(pCtx,lStack_38);
  }
  return 0;
}

Assistant:

static int jx9Builtin_idate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_int64 iVal = 0;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return -1*/
		jx9_result_int(pCtx, -1);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Perform the requested operation */
	switch(zFormat[0]){
	case 'd':
		/* Day of the month */
		iVal = sTm.tm_mday;
		break;
	case 'h':
		/*	Hour (12 hour format)*/
		iVal = 1 + (sTm.tm_hour % 12);
		break;
	case 'H':
		/* Hour (24 hour format)*/
		iVal = sTm.tm_hour;
		break;
	case 'i':
		/*Minutes*/
		iVal = sTm.tm_min;
		break;
	case 'I':
		/*	returns 1 if DST is activated, 0 otherwise */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
		iVal = sTm.tm_isdst;
		break;
	case 'L':
		/* 	returns 1 for leap year, 0 otherwise */
		iVal = IS_LEAP_YEAR(sTm.tm_year);
		break;
	case 'm':
		/* Month number*/
		iVal = sTm.tm_mon;
		break;
	case 's':
		/*Seconds*/
		iVal = sTm.tm_sec;
		break;
	case 't':{
		/*Days in current month*/
		static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
		int nDays = aMonDays[sTm.tm_mon % 12 ];
		if( sTm.tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(sTm.tm_year) ){
			nDays = 28;
		}
		iVal = nDays;
		break;
			 }
	case 'U':
		/*Seconds since the Unix Epoch*/
		iVal = (jx9_int64)time(0);
		break;
	case 'w':
		/*	Day of the week (0 on Sunday) */
		iVal = sTm.tm_wday;
		break;
	case 'W': {
		/* ISO-8601 week number of year, weeks starting on Monday */
		static const int aISO8601[] = { 7 /* Sunday */, 1 /* Monday */, 2, 3, 4, 5, 6 };
		iVal = aISO8601[sTm.tm_wday % 7 ];
		break;
			  }
	case 'y':
		/* Year (2 digits) */
		iVal = sTm.tm_year % 100;
		break;
	case 'Y':
		/* Year (4 digits) */
		iVal = sTm.tm_year;
		break;
	case 'z':
		/* Day of the year */
		iVal = sTm.tm_yday;
		break;
	case 'Z':
		/*Timezone offset in seconds*/
		iVal = sTm.tm_gmtoff;
		break;
	default:
		/* unknown format, throw a warning */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Unknown date format token");
		break;
	}
	/* Return the time value */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}